

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O0

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* wasm::DFA::Internal::refinePartitionsImpl
            (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *__return_storage_ptr__,InputGraph *inputGraph)

{
  pointer *ppuVar1;
  bool bVar2;
  reference this;
  size_type sVar3;
  reference this_00;
  reference pvVar4;
  reference pvVar5;
  size_t sVar6;
  size_t sVar7;
  reference puVar8;
  Set SVar9;
  unsigned_long local_3b0;
  size_t elem_1;
  Iterator __end3_3;
  Iterator __begin3_3;
  Set *__range3_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> resultPartition;
  Set partition_3;
  size_t p;
  Set local_358;
  size_t local_348;
  size_t newSplitter;
  size_t splitter_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4_1;
  Set splitter;
  size_t end;
  size_t t;
  size_t state_1;
  Iterator __end4;
  Iterator __begin4;
  Set *__range4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> markedSplitters;
  Set local_2a8;
  Set local_298;
  size_t local_288;
  size_t newPartition;
  size_t partition_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_2;
  Set partition_1;
  size_t state;
  size_t transition;
  Iterator __end3_1;
  Iterator __begin3_1;
  Set *__range3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> markedPartitions;
  size_t potentialSplitter;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> potentialSplitters;
  Partitions splitters;
  undefined1 local_130 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> transitionIndices;
  vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  transitions;
  Partitions partitions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *elem;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range3;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *partition;
  const_iterator __end2;
  const_iterator __begin2;
  InputGraph *__range2;
  size_t numTransitions;
  size_t numElements;
  InputGraph *inputGraph_local;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *resultPartitions;
  
  numTransitions = 0;
  __range2 = (InputGraph *)0x0;
  __end2 = std::
           vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ::begin(inputGraph);
  partition = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::end(inputGraph);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_*,_std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                                     *)&partition), bVar2) {
    this = __gnu_cxx::
           __normal_iterator<const_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_*,_std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
           ::operator*(&__end2);
    sVar3 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::size(this);
    numTransitions = sVar3 + numTransitions;
    __end3 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::begin(this);
    elem = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                       *)&elem), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::operator*(&__end3);
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
      __range2 = (InputGraph *)
                 ((long)&(__range2->
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + sVar3);
      __gnu_cxx::
      __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_*,_std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::operator++(&__end2);
  }
  anon_unknown_0::initializeStatePartitions
            ((Partitions *)
             &transitions.
              super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,inputGraph,numTransitions);
  ppuVar1 = &transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  ::vector((vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
            *)ppuVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
  anon_unknown_0::initializeTransitions
            (inputGraph,numTransitions,(size_t)__range2,
             (vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
              *)ppuVar1,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
  anon_unknown_0::initializeSplitterPartitions
            ((Partitions *)
             &potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Partitions *)
             &transitions.
              super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
              *)&transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
             (size_type)
             potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  potentialSplitter = 0;
  while( true ) {
    if (potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage <= potentialSplitter) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,&potentialSplitter);
    potentialSplitter = potentialSplitter + 1;
  }
  while( true ) {
    bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
    markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*pvVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3_1);
    SVar9 = anon_unknown_0::Partitions::getSet
                      ((Partitions *)
                       &potentialSplitters.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (size_t)markedPartitions.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    __begin3_1._M_current = &(SVar9.partitions)->sets;
    __end3_1 = anon_unknown_0::Partitions::Set::begin((Set *)&__begin3_1);
    transition = (size_t)anon_unknown_0::Partitions::Set::end((Set *)&__begin3_1);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&transition);
      if (!bVar2) break;
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end3_1);
      pvVar5 = std::
               vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
               ::operator[]((vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                             *)&transitionIndices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,*puVar8);
      partition_1.index = pvVar5->pred;
      SVar9 = anon_unknown_0::Partitions::getSetForElem
                        ((Partitions *)
                         &transitions.
                          super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,partition_1.index);
      partition_1.partitions = (Partitions *)SVar9.index;
      __range3_2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)SVar9.partitions;
      bVar2 = anon_unknown_0::Partitions::Set::hasMarks((Set *)&__range3_2);
      if (!bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3_1,
                   (value_type_conflict3 *)&partition_1);
      }
      anon_unknown_0::Partitions::mark
                ((Partitions *)
                 &transitions.
                  super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,partition_1.index);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end3_1);
    }
    __end3_2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3_1);
    partition_2 = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &__range3_1);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3_2,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&partition_2);
      if (!bVar2) break;
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end3_2);
      newPartition = *puVar8;
      SVar9 = anon_unknown_0::Partitions::getSet
                        ((Partitions *)
                         &transitions.
                          super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,newPartition);
      local_298 = SVar9;
      local_288 = anon_unknown_0::Partitions::Set::split(&local_298);
      if (local_288 != 0) {
        SVar9 = anon_unknown_0::Partitions::getSet
                          ((Partitions *)
                           &transitions.
                            super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_288);
        local_2a8 = SVar9;
        sVar7 = anon_unknown_0::Partitions::Set::size(&local_2a8);
        SVar9 = anon_unknown_0::Partitions::getSet
                          ((Partitions *)
                           &transitions.
                            super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,newPartition);
        markedSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = &(SVar9.partitions)->sets;
        sVar6 = anon_unknown_0::Partitions::Set::size
                          ((Set *)&markedSplitters.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar7 < sVar6) {
          local_288 = newPartition;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        SVar9 = anon_unknown_0::Partitions::getSet
                          ((Partitions *)
                           &transitions.
                            super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_288);
        __begin4._M_current = &(SVar9.partitions)->sets;
        __end4 = anon_unknown_0::Partitions::Set::begin((Set *)&__begin4);
        state_1 = (size_t)anon_unknown_0::Partitions::Set::end((Set *)&__begin4);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end4,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)&state_1);
          if (!bVar2) break;
          puVar8 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&__end4);
          sVar3 = *puVar8;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130,
                              sVar3);
          end = *pvVar4;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130,
                              sVar3 + 1);
          splitter.index = *pvVar4;
          for (; end < splitter.index; end = end + 1) {
            SVar9 = anon_unknown_0::Partitions::getSetForElem
                              ((Partitions *)
                               &potentialSplitters.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,end);
            splitter.partitions = (Partitions *)SVar9.index;
            __range4_1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)SVar9.partitions;
            bVar2 = anon_unknown_0::Partitions::Set::hasMarks((Set *)&__range4_1);
            if (!bVar2) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4,
                         (value_type_conflict3 *)&splitter);
            }
            anon_unknown_0::Partitions::mark
                      ((Partitions *)
                       &potentialSplitters.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,end);
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end4);
        }
        __end4_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        splitter_1 = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                        &__range4);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end4_1,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&splitter_1);
          if (!bVar2) break;
          puVar8 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&__end4_1);
          newSplitter = *puVar8;
          SVar9 = anon_unknown_0::Partitions::getSet
                            ((Partitions *)
                             &potentialSplitters.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,newSplitter);
          local_358 = SVar9;
          local_348 = anon_unknown_0::Partitions::Set::split(&local_358);
          if (local_348 != 0) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,&local_348);
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end4_1);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end3_2);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3_1);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve(__return_storage_ptr__,
            (size_type)
            transitions.
            super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (partition_3.index = 0;
      partition_3.index <
      transitions.
      super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage; partition_3.index = partition_3.index + 1)
  {
    SVar9 = anon_unknown_0::Partitions::getSet
                      ((Partitions *)
                       &transitions.
                        super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,partition_3.index);
    resultPartition.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &(SVar9.partitions)->sets;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3_3);
    sVar7 = anon_unknown_0::Partitions::Set::size
                      ((Set *)&resultPartition.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3_3,sVar7);
    ppuVar1 = &resultPartition.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    __end3_3 = anon_unknown_0::Partitions::Set::begin((Set *)ppuVar1);
    elem_1 = (size_t)anon_unknown_0::Partitions::Set::end((Set *)ppuVar1);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3_3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&elem_1);
      if (!bVar2) break;
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end3_3);
      local_3b0 = *puVar8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3_3,&local_3b0);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end3_3);
    }
    std::
    vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
    ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                *)__return_storage_ptr__,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3_3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3_3);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  anon_unknown_0::Partitions::~Partitions
            ((Partitions *)
             &potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
  std::
  vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  ::~vector((vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
             *)&transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  anon_unknown_0::Partitions::~Partitions
            ((Partitions *)
             &transitions.
              super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<size_t>>
refinePartitionsImpl(const InputGraph& inputGraph) {
  // Find the number of states and transitions.
  size_t numElements = 0;
  size_t numTransitions = 0;
  for (const auto& partition : inputGraph) {
    numElements += partition.size();
    for (const auto& elem : partition) {
      numTransitions += elem.size();
    }
  }

  // The partitions of DFA states.
  Partitions partitions = initializeStatePartitions(inputGraph, numElements);

  // The transitions arranged such that the transitions leading to state `q` are
  // `transitions[transitionIndices[q] : transitionIndices[q+1]]`.
  std::vector<Transition> transitions;
  std::vector<size_t> transitionIndices;
  initializeTransitions(
    inputGraph, numElements, numTransitions, transitions, transitionIndices);

  // The splitters, which are partitions of the input transitions.
  Partitions splitters =
    initializeSplitterPartitions(partitions, transitions, transitionIndices);

  // The list of splitter partitions that might be able to split states in some
  // state partition. Starts out containing all splitter partitions.
  std::vector<size_t> potentialSplitters;
  potentialSplitters.reserve(splitters.sets);
  for (size_t i = 0; i < splitters.sets; ++i) {
    potentialSplitters.push_back(i);
  }

  while (!potentialSplitters.empty()) {
    size_t potentialSplitter = potentialSplitters.back();
    potentialSplitters.pop_back();

    // The partitions that may be able to be split.
    std::vector<size_t> markedPartitions;

    // Mark states that are predecessors via this splitter partition.
    for (size_t transition : splitters.getSet(potentialSplitter)) {
      size_t state = transitions[transition].pred;
      auto partition = partitions.getSetForElem(state);
      if (!partition.hasMarks()) {
        markedPartitions.push_back(partition.index);
      }
      partitions.mark(state);
    }

    // Try to split each partition with marked states.
    for (size_t partition : markedPartitions) {
      size_t newPartition = partitions.getSet(partition).split();
      if (!newPartition) {
        // There was nothing to split.
        continue;
      }

      // We only want to keep using the smaller of the two split partitions.
      if (partitions.getSet(newPartition).size() <
          partitions.getSet(partition).size()) {
        newPartition = partition;
      }

      // The splitter partitions that may need to be split to match the new
      // split of the state partitions.
      std::vector<size_t> markedSplitters;

      // Mark transitions that lead to the newly split off states.
      for (size_t state : partitions.getSet(newPartition)) {
        for (size_t t = transitionIndices[state],
                    end = transitionIndices[state + 1];
             t < end;
             ++t) {
          auto splitter = splitters.getSetForElem(t);
          if (!splitter.hasMarks()) {
            markedSplitters.push_back(splitter.index);
          }
          splitters.mark(t);
        }
      }

      // Split the splitters and update `potentialSplitters`.
      for (size_t splitter : markedSplitters) {
        size_t newSplitter = splitters.getSet(splitter).split();
        if (newSplitter) {
          potentialSplitters.push_back(newSplitter);
        }
      }
    }
  }

  // Return the refined partitions.
  std::vector<std::vector<size_t>> resultPartitions;
  resultPartitions.reserve(partitions.sets);
  for (size_t p = 0; p < partitions.sets; ++p) {
    auto partition = partitions.getSet(p);
    std::vector<size_t> resultPartition;
    resultPartition.reserve(partition.size());
    for (size_t elem : partition) {
      resultPartition.push_back(elem);
    }
    resultPartitions.emplace_back(std::move(resultPartition));
  }
  return resultPartitions;
}